

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAdapter.cpp
# Opt level: O3

StickyAtypeParameters * __thiscall
OpenMD::StickyAdapter::getStickyParam
          (StickyAtypeParameters *__return_storage_ptr__,StickyAdapter *this)

{
  RealType RVar1;
  RealType RVar2;
  RealType RVar3;
  RealType RVar4;
  RealType RVar5;
  RealType RVar6;
  undefined8 uVar7;
  bool bVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_50 [16];
  string local_40;
  
  bVar8 = AtomType::hasProperty(this->at_,(string *)StickyTypeID_abi_cxx11_);
  if (!bVar8) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam was passed an atomType (%s)\n\tthat does not appear to be a Sticky atom.\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_50,(string *)this->at_);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam could not find Sticky\n\tparameters for atomType %s.\n",
             local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((_func_int **)local_50._0_8_ != (_func_int **)0x0) goto LAB_001e3df4;
LAB_001e3e34:
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "StickyAdapter::getStickyParam could not convert\n\tGenericData to StickyAtypeData for atom type %s\n"
             ,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    uVar10 = _DAT_00000028;
    uVar11 = uRam000000000000002c;
    uVar12 = uRam0000000000000030;
    uVar13 = uRam0000000000000034;
    uVar14 = _DAT_00000038;
    uVar15 = uRam000000000000003c;
    uVar16 = uRam0000000000000040;
    uVar17 = uRam0000000000000044;
    uVar18 = _DAT_00000048;
    uVar19 = uRam000000000000004c;
    uVar20 = uRam0000000000000050;
    uVar21 = uRam0000000000000054;
    uVar22 = _DAT_00000058;
    uVar23 = uRam000000000000005c;
    uVar24 = uRam0000000000000060;
    uVar25 = uRam0000000000000064;
  }
  else {
LAB_001e3df4:
    lVar9 = __dynamic_cast(local_50._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::StickyAtypeParameters>::typeinfo,0);
    if (lVar9 == 0) goto LAB_001e3e34;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
      }
      RVar1 = *(RealType *)(lVar9 + 0x28);
      RVar2 = *(RealType *)(lVar9 + 0x30);
      RVar3 = *(RealType *)(lVar9 + 0x38);
      RVar4 = *(RealType *)(lVar9 + 0x40);
      RVar5 = *(RealType *)(lVar9 + 0x48);
      RVar6 = *(RealType *)(lVar9 + 0x50);
      uVar7 = *(undefined8 *)(lVar9 + 0x60);
      __return_storage_ptr__->rup = *(RealType *)(lVar9 + 0x58);
      *(undefined8 *)&__return_storage_ptr__->isPower = uVar7;
      __return_storage_ptr__->ru = RVar5;
      __return_storage_ptr__->rlp = RVar6;
      __return_storage_ptr__->v0p = RVar3;
      __return_storage_ptr__->rl = RVar4;
      __return_storage_ptr__->w0 = RVar1;
      __return_storage_ptr__->v0 = RVar2;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      goto LAB_001e3efe;
    }
    uVar10 = *(undefined4 *)(lVar9 + 0x28);
    uVar11 = *(undefined4 *)(lVar9 + 0x2c);
    uVar12 = *(undefined4 *)(lVar9 + 0x30);
    uVar13 = *(undefined4 *)(lVar9 + 0x34);
    uVar14 = *(undefined4 *)(lVar9 + 0x38);
    uVar15 = *(undefined4 *)(lVar9 + 0x3c);
    uVar16 = *(undefined4 *)(lVar9 + 0x40);
    uVar17 = *(undefined4 *)(lVar9 + 0x44);
    uVar18 = *(undefined4 *)(lVar9 + 0x48);
    uVar19 = *(undefined4 *)(lVar9 + 0x4c);
    uVar20 = *(undefined4 *)(lVar9 + 0x50);
    uVar21 = *(undefined4 *)(lVar9 + 0x54);
    uVar22 = *(undefined4 *)(lVar9 + 0x58);
    uVar23 = *(undefined4 *)(lVar9 + 0x5c);
    uVar24 = *(undefined4 *)(lVar9 + 0x60);
    uVar25 = *(undefined4 *)(lVar9 + 100);
  }
  *(undefined4 *)&__return_storage_ptr__->rup = uVar22;
  *(undefined4 *)((long)&__return_storage_ptr__->rup + 4) = uVar23;
  *(undefined4 *)&__return_storage_ptr__->isPower = uVar24;
  *(undefined4 *)&__return_storage_ptr__->field_0x3c = uVar25;
  *(undefined4 *)&__return_storage_ptr__->ru = uVar18;
  *(undefined4 *)((long)&__return_storage_ptr__->ru + 4) = uVar19;
  *(undefined4 *)&__return_storage_ptr__->rlp = uVar20;
  *(undefined4 *)((long)&__return_storage_ptr__->rlp + 4) = uVar21;
  *(undefined4 *)&__return_storage_ptr__->v0p = uVar14;
  *(undefined4 *)((long)&__return_storage_ptr__->v0p + 4) = uVar15;
  *(undefined4 *)&__return_storage_ptr__->rl = uVar16;
  *(undefined4 *)((long)&__return_storage_ptr__->rl + 4) = uVar17;
  *(undefined4 *)&__return_storage_ptr__->w0 = uVar10;
  *(undefined4 *)((long)&__return_storage_ptr__->w0 + 4) = uVar11;
  *(undefined4 *)&__return_storage_ptr__->v0 = uVar12;
  *(undefined4 *)((long)&__return_storage_ptr__->v0 + 4) = uVar13;
LAB_001e3efe:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

StickyAtypeParameters StickyAdapter::getStickyParam() {
    if (!isSticky()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Sticky atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(StickyTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam could not find Sticky\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<StickyAtypeData> stickyData =
        std::dynamic_pointer_cast<StickyAtypeData>(data);
    if (stickyData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAdapter::getStickyParam could not convert\n"
               "\tGenericData to StickyAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return stickyData->getData();
  }